

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketInitiator::~ThreadedSocketInitiator(ThreadedSocketInitiator *this)

{
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__ThreadedSocketInitiator_001fe7b8;
  socket_term();
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_threads)._M_t);
  HostDetailsProvider::~HostDetailsProvider(&this->m_hostDetailsProvider);
  SessionSettings::~SessionSettings(&this->m_settings);
  Initiator::~Initiator(&this->super_Initiator);
  return;
}

Assistant:

ThreadedSocketInitiator::~ThreadedSocketInitiator() { socket_term(); }